

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O1

void pack_table(void)

{
  Yshort **ppYVar1;
  Yshort **ppYVar2;
  uint uVar3;
  Yshort YVar4;
  long lVar5;
  long lVar6;
  
  base = (Yshort *)allocate(nvectors << 2);
  pos = (Yshort *)allocate(nentries << 2);
  maxtable = 1000;
  table = (Yshort *)allocate(4000);
  check = (Yshort *)allocate(maxtable << 2);
  lowzero = 0;
  high = 0;
  if (0 < (long)maxtable) {
    memset(check,0xff,(long)maxtable << 2);
  }
  if (0 < nentries) {
    lVar5 = 0;
    do {
      uVar3 = matching_vector((int)lVar5);
      if ((int)uVar3 < 0) {
        YVar4 = pack_vector((int)lVar5);
      }
      else {
        YVar4 = base[uVar3];
      }
      pos[lVar5] = YVar4;
      base[order[lVar5]] = YVar4;
      lVar5 = lVar5 + 1;
    } while (lVar5 < nentries);
  }
  ppYVar2 = tos;
  ppYVar1 = froms;
  lVar5 = (long)nvectors;
  if (0 < lVar5) {
    lVar6 = 0;
    do {
      if (ppYVar1[lVar6] != (Yshort *)0x0) {
        free(ppYVar1[lVar6]);
      }
      if (ppYVar2[lVar6] != (Yshort *)0x0) {
        free(ppYVar2[lVar6]);
      }
      lVar6 = lVar6 + 1;
    } while (lVar5 != lVar6);
  }
  free(froms);
  free(tos);
  free(tally);
  free(width);
  free(pos);
  return;
}

Assistant:

void pack_table()
{
    register int i;
    register int place;
    register int state;

    base = NEW2(nvectors, Yshort);
    pos = NEW2(nentries, Yshort);

    maxtable = 1000;
    table = NEW2(maxtable, Yshort);
    check = NEW2(maxtable, Yshort);

    lowzero = 0;
    high = 0;

    for (i = 0; i < maxtable; i++)
	check[i] = -1;

    for (i = 0; i < nentries; i++)
    {
	state = matching_vector(i);

	if (state < 0)
	    place = pack_vector(i);
	else
	    place = base[state];

	pos[i] = place;
	base[order[i]] = place;
    }

    for (i = 0; i < nvectors; i++)
    {
	if (froms[i])
	    FREE(froms[i]);
	if (tos[i])
	    FREE(tos[i]);
    }

    FREE(froms);
    FREE(tos);
    FREE(tally);
    FREE(width);
    FREE(pos);
}